

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<std::complex<double>_>::Print
          (TPZMatrix<std::complex<double>_> *this,char *name,ostream *out,MatrixOutputFormat form)

{
  char cVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  ostream *poVar5;
  long lVar6;
  char *pcVar7;
  undefined8 uVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  char *extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double __z;
  double dVar13;
  double extraout_XMM0_Qa_04;
  char *extraout_XMM1_Qa;
  char *extraout_XMM1_Qa_00;
  char *extraout_XMM1_Qa_01;
  char *extraout_XMM1_Qa_02;
  char *extraout_XMM1_Qa_03;
  complex<double> val;
  ios cout_state;
  char local_181;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  double local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  ios local_138 [264];
  
  std::ios::ios(local_138,(streambuf *)0x0);
  std::ios::copyfmt((ios *)local_138);
  lVar6 = *(long *)out;
  *(undefined8 *)(out + *(long *)(lVar6 + -0x18) + 8) = 0x11;
  if (EFixedColumn < form) goto LAB_00c3e42d;
  pcVar11 = (char *)(this->super_TPZBaseMatrix).fRow;
  local_180 = (char *)(this->super_TPZBaseMatrix).fCol;
  iVar2 = (int)out;
  cVar1 = (char)out;
  local_170 = pcVar11;
  switch(form) {
  case EFormatted:
    pcVar9 = extraout_XMM1_Qa;
    std::__ostream_insert<char,std::char_traits<char>>(out,"Writing matrix \'",0x10);
    if (name != (char *)0x0) {
      sVar4 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>(out,name,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"\' (",3);
    poVar5 = std::ostream::_M_insert<long>((long)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," x ",3);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"):\n",3);
    if (0 < (long)pcVar11) {
      pcVar11 = (char *)0x0;
      local_168 = "\n";
      do {
        std::__ostream_insert<char,std::char_traits<char>>(out,"\t",1);
        if (0 < (long)local_180) {
          pcVar7 = (char *)0x0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (this,pcVar11,pcVar7);
            local_158 = extraout_XMM0_Qa;
            local_150 = pcVar9;
            poVar5 = std::operator<<(out,(complex *)&local_158);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
            pcVar7 = pcVar7 + 1;
          } while (local_180 != pcVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
        pcVar11 = pcVar11 + 1;
      } while (pcVar11 != local_170);
      goto LAB_00c3e41b;
    }
    lVar6 = 1;
    local_168 = "\n";
    goto LAB_00c3e420;
  case EInputFormat:
    poVar5 = std::ostream::_M_insert<long>((long)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    lVar6 = 9;
    local_168 = "-1 -1 0.\n";
    if (0 < (long)pcVar11) {
      pcVar9 = (char *)0x0;
      pcVar11 = extraout_XMM1_Qa_00;
      do {
        if (0 < (long)local_180) {
          pcVar7 = (char *)0x0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (this,pcVar9,pcVar7);
            local_158 = extraout_XMM0_Qa_00;
            local_150 = pcVar11;
            if (((extraout_XMM0_Qa_00 != 0.0) || (NAN(extraout_XMM0_Qa_00))) ||
               (((double)pcVar11 != 0.0 || (NAN((double)pcVar11))))) {
              poVar5 = std::ostream::_M_insert<long>((long)out);
              local_181 = ' ';
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_181,1);
              poVar5 = std::ostream::_M_insert<long>((long)poVar5);
              local_181 = ' ';
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_181,1);
              poVar5 = std::operator<<(poVar5,(complex *)&local_158);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
              std::ostream::put((char)poVar5);
              std::ostream::flush();
              pcVar11 = extraout_XMM1_Qa_01;
            }
            pcVar7 = pcVar7 + 1;
          } while (local_180 != pcVar7);
        }
        pcVar9 = pcVar9 + 1;
      } while (pcVar9 != local_170);
      lVar6 = 9;
    }
    goto LAB_00c3e420;
  case EMathematicaInput:
    if (name == (char *)0x0) {
      std::ios::clear(iVar2 + (int)*(undefined8 *)(lVar6 + -0x18));
      pcVar9 = extraout_XMM1_Qa_02;
    }
    else {
      pcVar9 = extraout_XMM1_Qa;
      sVar4 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>(out,name,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"\n{ ",3);
    if (0 < (long)pcVar11) {
      local_148 = local_180 + -1;
      local_140 = pcVar11 + -1;
      local_178 = (char *)0x0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(out,"\n{ ",3);
        if (0 < (long)local_180) {
          uVar12 = 1;
          pcVar11 = (char *)0x0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (this,local_178,pcVar11);
            local_168 = pcVar9;
            poVar5 = std::ostream::_M_insert<double>(extraout_XMM0_Qa_03);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"+I",2);
            std::ostream::_M_insert<double>((double)local_168);
            if ((long)pcVar11 < (long)local_148) {
              std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
            }
            if ((char *)((uVar12 / 6) * 6 + -1) == pcVar11) {
              local_158 = (double)CONCAT71(local_158._1_7_,10);
              std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_158,1);
            }
            pcVar11 = pcVar11 + 1;
            uVar12 = uVar12 + 1;
          } while (local_180 != pcVar11);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out," }",2);
        if ((long)local_178 < (long)local_140) {
          std::__ostream_insert<char,std::char_traits<char>>(out,",",1);
        }
        local_178 = local_178 + 1;
      } while (local_178 != local_170);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out," };",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    break;
  case EMatlabNonZeros:
    if (name == (char *)0x0) {
      std::ios::clear(iVar2 + (int)*(undefined8 *)(lVar6 + -0x18));
    }
    else {
      sVar4 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>(out,name,sVar4);
    }
    local_168 = "\n";
    if (0 < (long)pcVar11) {
      pcVar11 = (char *)0x0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(out,"\n|",2);
        if (0 < (long)local_180) {
          pcVar9 = (char *)0x0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (this,pcVar11,pcVar9);
            dVar13 = cabs(__z);
            pcVar7 = ".";
            if (1e-12 <= ABS(dVar13)) {
              pcVar7 = "#";
            }
            std::__ostream_insert<char,std::char_traits<char>>(out,pcVar7,1);
            pcVar9 = pcVar9 + 1;
          } while (local_180 != pcVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"|",1);
        pcVar11 = pcVar11 + 1;
      } while (pcVar11 != local_170);
    }
LAB_00c3e41b:
    lVar6 = 1;
LAB_00c3e420:
    std::__ostream_insert<char,std::char_traits<char>>(out,local_168,lVar6);
    break;
  case EMatrixMarket:
    iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])(this);
    local_168 = (char *)CONCAT44(local_168._4_4_,iVar3);
    local_148 = name;
    if (0 < (long)pcVar11) {
      pcVar9 = (char *)0x0;
      do {
        local_178 = pcVar9 + 1;
        pcVar7 = local_178;
        if ((int)local_168 == 0) {
          pcVar7 = pcVar11;
        }
        if ((long)pcVar7 < 2) {
          pcVar7 = (char *)0x1;
        }
        pcVar11 = (char *)0x0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (this,pcVar9,pcVar11);
          pcVar11 = pcVar11 + 1;
        } while (pcVar7 != pcVar11);
        pcVar9 = local_178;
        pcVar11 = local_170;
      } while (local_178 != local_170);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"%%",2);
    pcVar9 = local_148;
    if (local_148 == (char *)0x0) {
      std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)out + -0x18));
    }
    else {
      sVar4 = strlen(local_148);
      std::__ostream_insert<char,std::char_traits<char>>(out,pcVar9,sVar4);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    poVar5 = std::ostream::_M_insert<long>((long)out);
    local_158._0_1_ = (complex)0x20;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_158,1);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    local_158 = (double)CONCAT71(local_158._1_7_,0x20);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_158,1);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (0 < (long)pcVar11) {
      pcVar9 = (char *)0x0;
      pcVar7 = extraout_XMM1_Qa_03;
      do {
        local_180 = pcVar9 + 1;
        pcVar10 = local_180;
        if ((int)local_168 == 0) {
          pcVar10 = pcVar11;
        }
        if ((long)pcVar10 < 2) {
          pcVar10 = (char *)0x1;
        }
        pcVar11 = (char *)0x0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (this,pcVar9,pcVar11);
          local_158 = extraout_XMM0_Qa_04;
          local_150 = pcVar7;
          if ((((extraout_XMM0_Qa_04 != 0.0) || (NAN(extraout_XMM0_Qa_04))) ||
              ((double)pcVar7 != 0.0)) || (NAN((double)pcVar7))) {
            poVar5 = std::ostream::_M_insert<long>((long)out);
            local_181 = ' ';
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_181,1);
            poVar5 = std::ostream::_M_insert<long>((long)poVar5);
            local_181 = ' ';
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_181,1);
            poVar5 = std::operator<<(poVar5,(complex *)&local_158);
            local_181 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_181,1);
          }
          pcVar11 = pcVar11 + 1;
        } while (pcVar10 != pcVar11);
        pcVar11 = local_170;
        pcVar9 = local_180;
      } while (local_180 != local_170);
    }
    break;
  case ECSV:
    if (0 < (long)pcVar11) {
      pcVar9 = local_180 + -1;
      local_178 = pcVar11 + -1;
      pcVar7 = (char *)0x0;
      pcVar11 = extraout_XMM1_Qa;
      do {
        if (0 < (long)local_180) {
          pcVar10 = (char *)0x0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (this,pcVar7,pcVar10);
            local_168 = pcVar11;
            poVar5 = std::ostream::_M_insert<double>(extraout_XMM0_Qa_01);
            local_158 = (double)CONCAT71(local_158._1_7_,((double)local_168 <= 0.0) * '\x02' + '+');
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_158,1);
            poVar5 = std::ostream::_M_insert<double>(ABS((double)local_168));
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"j",1);
            if ((long)pcVar10 < (long)pcVar9) {
              std::__ostream_insert<char,std::char_traits<char>>(out," , ",3);
            }
            pcVar10 = pcVar10 + 1;
          } while (local_180 != pcVar10);
        }
        if ((long)pcVar7 < (long)local_178) {
          std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
        }
        pcVar7 = pcVar7 + 1;
      } while (pcVar7 != local_170);
    }
    break;
  case EFixedColumn:
    pcVar9 = extraout_XMM1_Qa;
    std::__ostream_insert<char,std::char_traits<char>>(out,"Writing matrix \'",0x10);
    if (name != (char *)0x0) {
      sVar4 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>(out,name,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"\' (",3);
    poVar5 = std::ostream::_M_insert<long>((long)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," x ",3);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"):\n",3);
    if (0 < (long)pcVar11) {
      pcVar11 = (char *)0x0;
      do {
        if (0 < (long)local_180) {
          pcVar7 = (char *)0x0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                      (this,pcVar11,pcVar7);
            local_178 = pcVar9;
            local_168 = extraout_XMM0_Qa_02;
            std::__ostream_insert<char,std::char_traits<char>>(out,"(",1);
            uVar8 = 0x12;
            if (0.0 <= (double)local_168) {
              uVar8 = 0x11;
              std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
            }
            lVar6 = *(long *)out;
            *(undefined8 *)(out + *(long *)(lVar6 + -0x18) + 0x10) = uVar8;
            lVar6 = *(long *)(lVar6 + -0x18);
            *(uint *)(out + lVar6 + 0x18) = *(uint *)(out + lVar6 + 0x18) & 0xffffff4f | 0x20;
            poVar5 = std::ostream::_M_insert<double>((double)local_168);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            std::__ostream_insert<char,std::char_traits<char>>(out,",",1);
            uVar8 = 0x12;
            if (0.0 <= (double)local_178) {
              uVar8 = 0x11;
              std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
            }
            lVar6 = *(long *)out;
            *(undefined8 *)(out + *(long *)(lVar6 + -0x18) + 0x10) = uVar8;
            lVar6 = *(long *)(lVar6 + -0x18);
            *(uint *)(out + lVar6 + 0x18) = *(uint *)(out + lVar6 + 0x18) & 0xffffff4f | 0x20;
            poVar5 = std::ostream::_M_insert<double>((double)local_178);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
            pcVar7 = pcVar7 + 1;
          } while (local_180 != pcVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
        pcVar11 = pcVar11 + 1;
      } while (pcVar11 != local_170);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
  }
LAB_00c3e42d:
  std::ios::copyfmt((ios *)(out + *(long *)(*(long *)out + -0x18)));
  std::ios_base::~ios_base((ios_base *)local_138);
  return;
}

Assistant:

void TPZMatrix<TVar>::Print(const char *name, std::ostream& out,const MatrixOutputFormat form) const {
    if constexpr (std::is_same<TVar, TFad<6, REAL>>::value ||
                  std::is_same<TVar, Fad<float>>::value ||
                  std::is_same<TVar, Fad<double>>::value ||
                  std::is_same<TVar, Fad<long double>>::value) {
        out << name << std::endl;
        for (int64_t i = 0; i < fRow; i++) {
            for (int64_t j = 0; j < fCol; j++) {
                out << "i = " << i << " j = " << j << " val " << Get(i, j) << std::endl;
            }
        }
        return;
   
    }
    //getting current settings of std::ostream instance
    std::ios cout_state(nullptr);
    cout_state.copyfmt(out);

    typedef std::numeric_limits< RTVar > typlim;
    out << std::setprecision(typlim::max_digits10);

    const auto nrows = Rows();
    const auto ncols = Cols();
    
    if(form == EFormatted) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << nrows << " x " << ncols << "):\n";
		
        for ( int64_t row = 0; row < nrows; row++) {
            out << "\t";
            for ( int64_t col = 0; col < ncols; col++ ) {
                out << GetVal( row, col) << "  ";//complex numbers are (a,b)
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EFixedColumn) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << nrows << " x " << ncols << "):\n";
        TVar value;
        constexpr int columnlength = typlim::max_digits10;

        auto PrintVal = [columnlength](std::ostream &out, RTVar val){
            if(val<0.) {
                out << std::setw(columnlength+1) << std::left << val << " ";
            }else{
                out << " ";
                out << std::setw(columnlength)   << std::left << val << " ";
            }
        };
        
        for ( int64_t row = 0; row < nrows; row++) {
            for ( int64_t col = 0; col < ncols; col++ ) {
                value = Get( row, col);
                if constexpr (std::is_same_v<RTVar,TVar>){
                    PrintVal(out,value);
                }else{
                    out<<"(";
                    PrintVal(out,value.real());
                    out<<",";
                    PrintVal(out,value.imag());
                    out<<")";
                }
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EInputFormat) {
        out << nrows << " " << ncols << endl;
        for ( int64_t row = 0; row < nrows; row++) {
            for ( int64_t col = 0; col < ncols; col++ ) {
                const TVar val = GetVal(row, col);
                if(val != (TVar)0.) out << row << ' ' << col << ' ' << val << std::endl;
            }
        }
        out << "-1 -1 0.\n";
    } else if( form == EMathematicaInput)
        {
            
            out << name << "\n{ ";
            for ( int64_t row = 0; row < nrows; row++) {
                out << "\n{ ";
                for ( int64_t col = 0; col < ncols; col++ ) {
                    const TVar val = GetVal(row, col);
                    if constexpr (std::is_same_v<TVar,RTVar>){
                        out << val;
                    }else{
                        out << val.real() << "+I"<<val.imag();
                    }
                    if(col < ncols-1)
                        out << ", ";
                    if((col+1) % 6 == 0) out << '\n';
                }
                out << " }";
                if(row < nrows-1)
                    out << ",";
            }
		
            out << " };"<<std::endl;
		
        }else if( form == ECSV)
        {
         
            for ( int64_t row = 0; row < nrows; row++) {
                for ( int64_t col = 0; col < ncols; col++ ) {
                    const TVar val = GetVal(row, col);
                    if constexpr (std::is_same_v<TVar,RTVar>){
                        out << val;
                    }else{
                        const auto signchar = val.imag() > 0 ? '+' : '-';
                        out << val.real() <<signchar<<std::fabs(val.imag())<<"j";
                    }
                    if(col < ncols-1)  out << " , ";
                }
                if(row < nrows-1)
                    out << "\n";
            }

        } else if( form == EMatlabNonZeros)
        {
            out << name;
            for ( int64_t row = 0; row < nrows; row++) {
                out << "\n|";
                for ( int64_t col = 0; col < ncols; col++ )
                    if(IsZero(GetVal(row, col)) ){
                        out << ".";
                    }else{
                        out << "#";
                    }
                out << "|";
            }
            out << "\n";
        }
    else if( form == EMatrixMarket)
        {
            bool sym = IsSymmetric();
            int64_t numzero = 0;
            int64_t nrow = nrows;
            for ( int64_t row = 0; row < nrows; row++) {
                int64_t colmax = nrow;
                if (sym) colmax = row+1;
                for (int64_t col = 0; col < colmax; col++ )
                    {
                        TVar val = GetVal(row, col);
                        if (val != (TVar)0.) {
                            numzero++;
                        }
                    }
            }
            out << "%%"<< name << std::endl;
            out << nrows << ' ' << ncols << ' ' << numzero << std::endl;
            for ( int64_t row = 0; row < nrows; row++) {
                int64_t colmax = nrow;
                if (sym) colmax = row+1;
                for (int64_t col = 0; col < colmax; col++ )
                    {
                        const TVar val = GetVal(row, col);
                        if (val != (TVar)0.) {
                            out << row+1 << ' ' << col+1 << ' ' << val << '\n';
                        }
                    }
            }
        }
    //restore precision
    out.copyfmt(cout_state);
}